

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockwise.c
# Opt level: O0

void cf_blockwise_acc_pad
               (uint8_t *partial,size_t *npartial,size_t nblock,uint8_t fbyte,uint8_t mbyte,
               uint8_t lbyte,size_t nbytes,cf_blockwise_in_fn process,void *ctx)

{
  uint8_t local_23;
  uint8_t local_22;
  byte local_21;
  uint8_t lbyte_local;
  uint8_t mbyte_local;
  size_t sStack_20;
  uint8_t fbyte_local;
  size_t nblock_local;
  size_t *npartial_local;
  uint8_t *partial_local;
  
  if (nbytes != 0) {
    local_23 = lbyte;
    local_22 = mbyte;
    sStack_20 = nblock;
    nblock_local = (size_t)npartial;
    npartial_local = (size_t *)partial;
    if (nbytes == 1) {
      local_21 = fbyte ^ lbyte;
      cf_blockwise_accumulate(partial,npartial,nblock,&local_21,1,process,ctx);
    }
    else {
      local_21 = fbyte;
      if (nbytes == 2) {
        cf_blockwise_accumulate(partial,npartial,nblock,&local_21,1,process,ctx);
        cf_blockwise_accumulate
                  ((uint8_t *)npartial_local,(size_t *)nblock_local,sStack_20,&local_23,1,process,
                   ctx);
      }
      else {
        cf_blockwise_accumulate(partial,npartial,nblock,&local_21,1,process,ctx);
        if (local_23 == local_22) {
          cf_blockwise_acc_byte
                    ((uint8_t *)npartial_local,(size_t *)nblock_local,sStack_20,local_22,nbytes - 1,
                     process,ctx);
        }
        else {
          cf_blockwise_acc_byte
                    ((uint8_t *)npartial_local,(size_t *)nblock_local,sStack_20,local_22,nbytes - 2,
                     process,ctx);
          cf_blockwise_accumulate
                    ((uint8_t *)npartial_local,(size_t *)nblock_local,sStack_20,&local_23,1,process,
                     ctx);
        }
      }
    }
  }
  return;
}

Assistant:

void cf_blockwise_acc_pad(uint8_t *partial, size_t *npartial,
                          size_t nblock,
                          uint8_t fbyte, uint8_t mbyte, uint8_t lbyte,
                          size_t nbytes,
                          cf_blockwise_in_fn process,
                          void *ctx)
{

  switch (nbytes)
  {
    case 0: break;
    case 1: fbyte ^= lbyte;
            cf_blockwise_accumulate(partial, npartial, nblock, &fbyte, 1, process, ctx);
            break;
    case 2:
            cf_blockwise_accumulate(partial, npartial, nblock, &fbyte, 1, process, ctx);
            cf_blockwise_accumulate(partial, npartial, nblock, &lbyte, 1, process, ctx);
            break;
    default:
            cf_blockwise_accumulate(partial, npartial, nblock, &fbyte, 1, process, ctx);

            /* If the middle and last bytes differ, then process the last byte separately.
             * Otherwise, just extend the middle block size. */
            if (lbyte != mbyte)
            {
              cf_blockwise_acc_byte(partial, npartial, nblock, mbyte, nbytes - 2, process, ctx);
              cf_blockwise_accumulate(partial, npartial, nblock, &lbyte, 1, process, ctx);
            } else {
              cf_blockwise_acc_byte(partial, npartial, nblock, mbyte, nbytes - 1, process, ctx);
            }

            break;
  }
}